

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  CppType CVar3;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  GeneratorOptions *options_00;
  string *psVar4;
  int i;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  char *pcVar5;
  BytesMode in_R8D;
  BytesMode bytes_mode;
  undefined1 in_R9B;
  undefined1 drop_list;
  undefined8 uVar6;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar4 = &local_b0;
  SimpleItoa_abi_cxx11_(psVar4,(protobuf *)(ulong)*(uint *)(field + 0x38),(int)printer);
  io::Printer::Print(printer,"    case $num$:\n","num",psVar4);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_00 = anon_unknown_0::MapFieldKey(field);
    this_01 = anon_unknown_0::MapFieldValue(field);
    psVar4 = &local_b0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (psVar4,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0,
               in_R8D,(bool)in_R9B);
    io::Printer::Print(printer,
                       "      var value = msg.get$name$();\n      reader.readMessage(value, function(message, reader) {\n"
                       ,"name",psVar4);
    std::__cxx11::string::~string((string *)&local_b0);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)this_00,options_01,(FieldDescriptor *)psVar4);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)this_01,options_02,(FieldDescriptor *)psVar4);
    psVar4 = &local_b0;
    io::Printer::Print(printer,
                       "        jspb.Map.deserializeBinary(message, reader, $keyReaderFn$, $valueReaderFn$"
                       ,"keyReaderFn",psVar4,"valueReaderFn",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    TVar2 = FieldDescriptor::type(this_01);
    if (TVar2 == TYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_b0,(_anonymous_namespace_ *)options,options_00,(Descriptor *)psVar4);
      io::Printer::Print(printer,", $messageType$.deserializeBinaryFromReader","messageType",
                         &local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    io::Printer::Print(printer,");\n");
    io::Printer::Print(printer,"         });\n");
    goto LAB_0025909f;
  }
  uVar6 = 0x258edb;
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)psVar4);
    TVar2 = FieldDescriptor::type(field);
    pcVar5 = "Message";
    if (TVar2 == TYPE_GROUP) {
      pcVar5 = "Group";
    }
    std::__cxx11::string::string((string *)&local_90,pcVar5,&local_b1);
    TVar2 = FieldDescriptor::type(field);
    if (TVar2 == TYPE_GROUP) {
      SimpleItoa_abi_cxx11_(&local_70,(protobuf *)(ulong)*(uint *)(field + 0x38),i);
      std::operator+(&local_50,&local_70,", ");
    }
    else {
      std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_70);
    }
    bytes_mode = 0x349b14;
    psVar4 = &local_90;
    io::Printer::Print(printer,
                       "      var value = new $fieldclass$;\n      reader.read$msgOrGroup$($grpfield$value,$fieldclass$.deserializeBinaryFromReader);\n"
                       ,"fieldclass",&local_b0,"msgOrGroup",psVar4,"grpfield",&local_50);
    drop_list = SUB81(psVar4,0);
    std::__cxx11::string::~string((string *)&local_50);
    if (TVar2 == TYPE_GROUP) {
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  else {
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,true,true,true,(BytesMode)uVar6);
    (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,SUB81(uVar6,0));
    bytes_mode = 0x3706ba;
    psVar4 = &local_90;
    io::Printer::Print(printer,
                       "      var value = /** @type {$fieldtype$} */ (reader.read$reader$());\n",
                       "fieldtype",&local_b0,"reader",psVar4);
    drop_list = SUB81(psVar4,0);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  if (*(int *)(field + 0x4c) == 3) {
    bVar1 = FieldDescriptor::is_packed(field);
    if (bVar1) goto LAB_00259038;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x1,bytes_mode,(bool)drop_list);
    io::Printer::Print(printer,"      msg.add$name$(value);\n","name",&local_b0);
  }
  else {
LAB_00259038:
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,bytes_mode,(bool)drop_list);
    io::Printer::Print(printer,"      msg.set$name$(value);\n","name",&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_b0);
LAB_0025909f:
  io::Printer::Print(printer,"      break;\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinaryField(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {

  printer->Print("    case $num$:\n",
                 "num", SimpleItoa(field->number()));

  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "      var value = msg.get$name$();\n"
        "      reader.readMessage(value, function(message, reader) {\n",
        "name", JSGetterName(options, field));

    printer->Print("        jspb.Map.deserializeBinary(message, reader, "
                   "$keyReaderFn$, $valueReaderFn$",
          "keyReaderFn", JSBinaryReaderMethodName(options, key_field),
          "valueReaderFn", JSBinaryReaderMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.deserializeBinaryFromReader",
          "messageType", GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
    printer->Print("         });\n");
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          "      var value = new $fieldclass$;\n"
          "      reader.read$msgOrGroup$($grpfield$value,"
          "$fieldclass$.deserializeBinaryFromReader);\n",
        "fieldclass", SubmessageTypeRef(options, field),
          "msgOrGroup", (field->type() == FieldDescriptor::TYPE_GROUP) ?
                        "Group" : "Message",
          "grpfield", (field->type() == FieldDescriptor::TYPE_GROUP) ?
                      (SimpleItoa(field->number()) + ", ") : "");
    } else {
      printer->Print(
          "      var value = /** @type {$fieldtype$} */ "
          "(reader.read$reader$());\n",
          "fieldtype", JSFieldTypeAnnotation(options, field, false, true,
                                             /* singular_if_not_packed */ true,
                                             BYTES_U8),
          "reader",
          JSBinaryReadWriteMethodName(field, /* is_writer = */ false));
    }

    if (field->is_repeated() && !field->is_packed()) {
      printer->Print(
          "      msg.add$name$(value);\n", "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else {
      // Singular fields, and packed repeated fields, receive a |value| either
      // as the field's value or as the array of all the field's values; set
      // this as the field's value directly.
      printer->Print(
          "      msg.set$name$(value);\n",
          "name", JSGetterName(options, field));
    }
  }

  printer->Print("      break;\n");
}